

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O2

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar8 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  pvVar3 = (this->bias_data).data;
  uVar10 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar10;
  }
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar10;
  }
  sVar4 = bottom_top_blob->elemsize;
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    fVar1 = *(float *)((long)pvVar3 + uVar10 * 4);
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      *(float *)((long)pvVar8 + uVar9 * 4) = *(float *)((long)pvVar8 + uVar9 * 4) + fVar1;
    }
    pvVar8 = (void *)((long)pvVar8 + sVar2 * sVar4);
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i = 0; i < size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}